

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddClip.c
# Opt level: O2

DdNode * Cudd_bddClippingAndAbstract
                   (DdManager *dd,DdNode *f,DdNode *g,DdNode *cube,int maxDepth,int direction)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddBddClipAndAbsRecur(dd,f,g,cube,maxDepth,direction);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddClippingAndAbstract(
  DdManager * dd /* manager */,
  DdNode * f /* first conjunct */,
  DdNode * g /* second conjunct */,
  DdNode * cube /* cube of variables to be abstracted */,
  int  maxDepth /* maximum recursion depth */,
  int  direction /* under (0) or over (1) approximation */)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddBddClippingAndAbstract(dd,f,g,cube,maxDepth,direction);
    } while (dd->reordered == 1);
    return(res);

}